

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::WriteNode(cmGraphVizWriter *this,cmGeneratedFileStream *fs,cmLinkItem *item)

{
  TargetType TVar1;
  string *__k;
  mapped_type *pmVar2;
  ostream *poVar3;
  char *pcVar4;
  string escapedLabel;
  string itemNameWithAliases;
  string local_70;
  string local_50;
  
  __k = cmLinkItem::AsStr_abi_cxx11_(item);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->NodeNames,__k);
  ItemNameWithAliases(&local_50,this,__k);
  EscapeForDotFile(&local_70,&local_50);
  poVar3 = std::operator<<((ostream *)fs,"    \"");
  poVar3 = std::operator<<(poVar3,(string *)pmVar2);
  poVar3 = std::operator<<(poVar3,"\" [ label = \"");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"\", shape = ");
  pcVar4 = "septagon";
  if (item->Target != (cmGeneratorTarget *)0x0) {
    TVar1 = cmGeneratorTarget::GetType(item->Target);
    if (TVar1 < UNKNOWN_LIBRARY) {
      pcVar4 = &DAT_006b1660 + *(int *)(&DAT_006b1660 + (ulong)TVar1 * 4);
    }
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3," ];\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmGraphVizWriter::WriteNode(cmGeneratedFileStream& fs,
                                 cmLinkItem const& item)
{
  auto const& itemName = item.AsStr();
  auto const& nodeName = this->NodeNames[itemName];

  auto const itemNameWithAliases = this->ItemNameWithAliases(itemName);
  auto const escapedLabel = EscapeForDotFile(itemNameWithAliases);

  fs << "    \"" << nodeName << "\" [ label = \"" << escapedLabel
     << "\", shape = " << getShapeForTarget(item) << " ];\n";
}